

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O1

bool __thiscall
Inline::TryOptimizeCallInstrWithFixedMethod
          (Inline *this,Instr *callInstr,FunctionJITTimeInfo *inlineeInfo,bool isPolymorphic,
          bool isBuiltIn,bool isCtor,bool isInlined,bool *safeThis,bool dontOptimizeJustCheck,uint i
          )

{
  OpCode OVar1;
  uint uVar2;
  InlineCacheIndex IVar3;
  _func_int **pp_Var4;
  ThreadContextInfo *pTVar5;
  Func *this_00;
  code *pcVar6;
  bool bVar7;
  bool bVar8;
  OpndKind OVar9;
  bool bVar10;
  ValueType valueType;
  uint uVar11;
  uint uVar12;
  PropertyId PVar13;
  TypeId TVar14;
  JITTimeFunctionBody *pJVar15;
  FunctionJITTimeInfo *pFVar16;
  char16_t *pcVar17;
  JITTimeFunctionBody *pJVar18;
  char16 *pcVar19;
  char16 *pcVar20;
  char16 *pcVar21;
  intptr_t iVar22;
  undefined4 *puVar23;
  StackSym *pSVar24;
  PropertySymOpnd *this_01;
  FixedFieldInfo *this_02;
  intptr_t iVar25;
  Opnd *pOVar26;
  PropertyRecord *pPVar27;
  Instr *pIVar28;
  BailOutInfo *pBVar29;
  SymOpnd *this_03;
  PropertySymOpnd *pPVar30;
  JITTimeConstructorCache *this_04;
  ProfiledInstr *pPVar31;
  AddrOpnd *src1Opnd;
  Instr *pIVar32;
  RegOpnd *pRVar33;
  BailOutKind kind;
  char16_t *pcVar34;
  ThreadContext *pTVar35;
  char16_t *pcVar36;
  char16_t *pcVar37;
  char16_t *pcVar38;
  char16_t *pcVar39;
  bool bVar40;
  wchar local_148 [4];
  char16 debugStringBuffer2 [42];
  wchar local_e8 [4];
  char16 debugStringBuffer [42];
  char16_t *local_50;
  
  pJVar15 = JITTimeWorkItem::GetJITFunctionBody(callInstr->m_func->m_workItem);
  uVar11 = JITTimeFunctionBody::GetSourceContextId(pJVar15);
  pFVar16 = JITTimeWorkItem::GetJITTimeInfo(callInstr->m_func->m_workItem);
  uVar12 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar16);
  bVar7 = Js::Phases::IsEnabled((Phases *)&DAT_015bbe90,FixedMethodsPhase,uVar11,uVar12);
  if (bVar7) {
    return false;
  }
  pJVar15 = JITTimeWorkItem::GetJITFunctionBody(callInstr->m_func->m_workItem);
  uVar11 = JITTimeFunctionBody::GetSourceContextId(pJVar15);
  pFVar16 = JITTimeWorkItem::GetJITTimeInfo(callInstr->m_func->m_workItem);
  uVar12 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar16);
  bVar7 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,FixedMethodsPhase,uVar11,uVar12);
  if (bVar7) {
LAB_0054bd31:
    if (!dontOptimizeJustCheck) goto LAB_0054bd3b;
LAB_0054bdec:
    bVar7 = false;
  }
  else {
    pJVar15 = JITTimeWorkItem::GetJITFunctionBody(callInstr->m_func->m_workItem);
    uVar11 = JITTimeFunctionBody::GetSourceContextId(pJVar15);
    pFVar16 = JITTimeWorkItem::GetJITTimeInfo(callInstr->m_func->m_workItem);
    uVar12 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar16);
    bVar7 = Js::Phases::IsEnabled((Phases *)&DAT_015d3490,FixedMethodsPhase,uVar11,uVar12);
    if (bVar7) goto LAB_0054bd31;
    if (!isCtor) goto LAB_0054bdec;
    pJVar15 = JITTimeWorkItem::GetJITFunctionBody(callInstr->m_func->m_workItem);
    uVar11 = JITTimeFunctionBody::GetSourceContextId(pJVar15);
    pFVar16 = JITTimeWorkItem::GetJITTimeInfo(callInstr->m_func->m_workItem);
    uVar12 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar16);
    bVar7 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,FixedNewObjPhase,uVar11,uVar12);
    if (bVar7) goto LAB_0054bd31;
    pJVar15 = JITTimeWorkItem::GetJITFunctionBody(callInstr->m_func->m_workItem);
    uVar11 = JITTimeFunctionBody::GetSourceContextId(pJVar15);
    pFVar16 = JITTimeWorkItem::GetJITTimeInfo(callInstr->m_func->m_workItem);
    uVar12 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar16);
    bVar7 = Js::Phases::IsEnabled((Phases *)&DAT_015d3490,FixedNewObjPhase,uVar11,uVar12);
    if (!bVar7 || dontOptimizeJustCheck) goto LAB_0054bdec;
LAB_0054bd3b:
    bVar7 = true;
  }
  if (bVar7) {
    if ((inlineeInfo == (FunctionJITTimeInfo *)0x0) ||
       (bVar8 = FunctionJITTimeInfo::HasBody(inlineeInfo), !bVar8)) {
      pJVar15 = (JITTimeFunctionBody *)0x0;
    }
    else {
      pJVar15 = FunctionJITTimeInfo::GetBody(inlineeInfo);
    }
    if (pJVar15 == (JITTimeFunctionBody *)0x0) {
      pcVar17 = L"<unknown>";
    }
    else {
      pcVar17 = JITTimeFunctionBody::GetDisplayName(pJVar15);
    }
    pJVar18 = JITTimeWorkItem::GetJITFunctionBody(callInstr->m_func->m_workItem);
    pcVar19 = JITTimeFunctionBody::GetDisplayName(pJVar18);
    pFVar16 = JITTimeWorkItem::GetJITTimeInfo(callInstr->m_func->m_workItem);
    pcVar20 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar16,(wchar (*) [42])local_e8);
    if (pJVar15 == (JITTimeFunctionBody *)0x0) {
      pcVar21 = L"(null)";
    }
    else {
      pcVar21 = FunctionJITTimeInfo::GetDebugNumberSet(inlineeInfo,(wchar (*) [42])local_148);
    }
    if (inlineeInfo == (FunctionJITTimeInfo *)0x0) {
      iVar22 = 0;
    }
    else {
      iVar22 = FunctionJITTimeInfo::GetFunctionInfoAddr(inlineeInfo);
    }
    Output::Print(L"FixedFields: function %s (%s): considering method (%s %s): polymorphic = %d, built-in = %d, ctor = %d, inlined = %d, functionInfo = %p.\n"
                  ,pcVar19,pcVar20,pcVar17,pcVar21,(ulong)isPolymorphic,(ulong)isBuiltIn,isCtor,
                  (ulong)isInlined,iVar22);
    Output::Flush();
  }
  if ((isPolymorphic && !dontOptimizeJustCheck) && isInlined) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar23 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar23 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x633,"(dontOptimizeJustCheck)","dontOptimizeJustCheck");
    if (!bVar8) goto LAB_0054d099;
    *puVar23 = 0;
  }
  pOVar26 = callInstr->m_src1;
  OVar9 = IR::Opnd::GetKind(pOVar26);
  if (OVar9 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar23 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar23 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar8) goto LAB_0054d099;
    *puVar23 = 0;
  }
  pp_Var4 = pOVar26[1]._vptr_Opnd;
  if (*(char *)((long)pp_Var4 + 0x14) != '\x01') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar23 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar23 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                       ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
    if (!bVar8) {
LAB_0054d099:
      pcVar6 = (code *)invalidInstructionException();
      (*pcVar6)();
    }
    *puVar23 = 0;
  }
  pIVar28 = (Instr *)pp_Var4[5];
  if ((pIVar28 != (Instr *)0x0 & *(byte *)(pp_Var4 + 3)) == 1) {
    pcVar17 = L"inlining";
    local_50 = L"inlining";
    if (inlineeInfo == (FunctionJITTimeInfo *)0x0) {
      pcVar17 = L"calling";
    }
    do {
      OVar1 = pIVar28->m_opcode;
      if (OVar1 != BytecodeArgOutCapture) {
        if (((0x27 < OVar1 - 0x5e) || ((0x8000015401U >> ((ulong)(OVar1 - 0x5e) & 0x3f) & 1) == 0))
           && (OVar1 != LdMethodFromFlags)) {
          if (!bVar7) {
            return false;
          }
          if ((inlineeInfo == (FunctionJITTimeInfo *)0x0) ||
             (bVar7 = FunctionJITTimeInfo::HasBody(inlineeInfo), !bVar7)) {
            pJVar15 = (JITTimeFunctionBody *)0x0;
          }
          else {
            pJVar15 = FunctionJITTimeInfo::GetBody(inlineeInfo);
          }
          if (pJVar15 == (JITTimeFunctionBody *)0x0) {
            pcVar17 = L"<unknown>";
          }
          else {
            pcVar17 = JITTimeFunctionBody::GetDisplayName(pJVar15);
          }
          pJVar18 = JITTimeWorkItem::GetJITFunctionBody(callInstr->m_func->m_workItem);
          pcVar19 = JITTimeFunctionBody::GetDisplayName(pJVar18);
          pFVar16 = JITTimeWorkItem::GetJITTimeInfo(callInstr->m_func->m_workItem);
          pcVar20 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar16,(wchar (*) [42])local_e8);
          if (inlineeInfo == (FunctionJITTimeInfo *)0x0) {
            local_50 = L"calling";
          }
          if (pJVar15 == (JITTimeFunctionBody *)0x0) {
            pcVar21 = L"(null)";
          }
          else {
            pcVar21 = FunctionJITTimeInfo::GetDebugNumberSet(inlineeInfo,(wchar (*) [42])local_148);
          }
          pcVar39 = 
          L"FixedFields: function %s (%s): %s non-fixed method (%s %s), because callee does not come from LdMethodFld.\n"
          ;
          goto LAB_0054c593;
        }
        this_01 = IR::Opnd::AsPropertySymOpnd(pIVar28->m_src1);
        if (isCtor) {
          if (isInlined) {
            pJVar15 = JITTimeWorkItem::GetJITFunctionBody(callInstr->m_func->m_workItem);
            uVar11 = JITTimeFunctionBody::GetSourceContextId(pJVar15);
            pFVar16 = JITTimeWorkItem::GetJITTimeInfo(callInstr->m_func->m_workItem);
            uVar12 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar16);
            bVar8 = Js::Phases::IsEnabled
                              ((Phases *)&DAT_015bbe90,FixedCtorInliningPhase,uVar11,uVar12);
            if (!bVar8) {
              if (!isInlined) goto LAB_0054c24c;
              goto LAB_0054c29c;
            }
          }
          else {
LAB_0054c24c:
            pJVar15 = JITTimeWorkItem::GetJITFunctionBody(callInstr->m_func->m_workItem);
            uVar11 = JITTimeFunctionBody::GetSourceContextId(pJVar15);
            pFVar16 = JITTimeWorkItem::GetJITTimeInfo(callInstr->m_func->m_workItem);
            uVar12 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar16);
            bVar8 = Js::Phases::IsEnabled((Phases *)&DAT_015bbe90,FixedCtorCallsPhase,uVar11,uVar12)
            ;
            if (!bVar8) {
LAB_0054c29c:
              if ((this_01->objTypeSpecFldInfo == (ObjTypeSpecFldInfo *)0x0) ||
                 (bVar8 = ObjTypeSpecFldInfo::UsesAccessor(this_01->objTypeSpecFldInfo), !bVar8)) {
                if (!isCtor) goto LAB_0054c2bc;
                goto LAB_0054c422;
              }
            }
          }
LAB_0054c46f:
          if (!bVar7) {
            return false;
          }
          if ((inlineeInfo == (FunctionJITTimeInfo *)0x0) ||
             (bVar7 = FunctionJITTimeInfo::HasBody(inlineeInfo), !bVar7)) {
            pJVar15 = (JITTimeFunctionBody *)0x0;
          }
          else {
            pJVar15 = FunctionJITTimeInfo::GetBody(inlineeInfo);
          }
          if (pJVar15 == (JITTimeFunctionBody *)0x0) {
            pcVar17 = L"<unknown>";
          }
          else {
            pcVar17 = JITTimeFunctionBody::GetDisplayName(pJVar15);
          }
          pJVar18 = JITTimeWorkItem::GetJITFunctionBody(callInstr->m_func->m_workItem);
          PVar13 = JITTimeFunctionBody::GetPropertyIdFromCacheId
                             (pJVar18,this_01->m_inlineCacheIndex);
          pTVar5 = callInstr->m_func->m_threadContextInfo;
          pTVar35 = (ThreadContext *)pTVar5[-3].wellKnownHostTypeIds;
          if (pTVar5 == (ThreadContextInfo *)0x0) {
            pTVar35 = (ThreadContext *)0x0;
          }
          pPVar27 = ThreadContext::GetPropertyRecord(pTVar35,PVar13);
          pJVar18 = JITTimeWorkItem::GetJITFunctionBody(callInstr->m_func->m_workItem);
          pcVar19 = JITTimeFunctionBody::GetDisplayName(pJVar18);
          pFVar16 = JITTimeWorkItem::GetJITTimeInfo(callInstr->m_func->m_workItem);
          pcVar20 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar16,(wchar (*) [42])local_e8);
          pcVar39 = L"inlining";
          if (inlineeInfo == (FunctionJITTimeInfo *)0x0) {
            pcVar39 = L"calling";
          }
          if (pJVar15 == (JITTimeFunctionBody *)0x0) {
            pcVar36 = L"(null)";
          }
          else {
            pcVar36 = FunctionJITTimeInfo::GetDebugNumberSet(inlineeInfo,(wchar (*) [42])local_148);
          }
          pcVar37 = L"inlining";
          if (!isInlined) {
            pcVar37 = L"calling";
          }
          pcVar38 = L"script";
          if (isBuiltIn) {
            pcVar38 = L"built-in";
          }
          pcVar34 = L"methods";
          if (isCtor) {
            pcVar34 = L"ctors";
          }
          Output::Print(L"FixedFields: function %s (#%u): %s non-fixed method %s (%s #%u) (cache id: %d), because %s fixed %s %s is disabled.\n"
                        ,pcVar19,pcVar20,pcVar39,pPVar27 + 1,pcVar17,pcVar36,
                        (ulong)this_01->m_inlineCacheIndex,pcVar37,pcVar38,pcVar34);
          goto LAB_0054c6d7;
        }
LAB_0054c2bc:
        if (isBuiltIn) {
          if (isInlined) {
            pJVar15 = JITTimeWorkItem::GetJITFunctionBody(callInstr->m_func->m_workItem);
            uVar11 = JITTimeFunctionBody::GetSourceContextId(pJVar15);
            pFVar16 = JITTimeWorkItem::GetJITTimeInfo(callInstr->m_func->m_workItem);
            uVar12 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar16);
            bVar8 = Js::Phases::IsEnabled
                              ((Phases *)&DAT_015bbe90,FixedBuiltInMethodInliningPhase,uVar11,uVar12
                              );
            if (bVar8) goto LAB_0054c46f;
            if (!isInlined) goto LAB_0054c321;
          }
          else {
LAB_0054c321:
            pJVar15 = JITTimeWorkItem::GetJITFunctionBody(callInstr->m_func->m_workItem);
            uVar11 = JITTimeFunctionBody::GetSourceContextId(pJVar15);
            pFVar16 = JITTimeWorkItem::GetJITTimeInfo(callInstr->m_func->m_workItem);
            uVar12 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar16);
            bVar8 = Js::Phases::IsEnabled
                              ((Phases *)&DAT_015bbe90,FixedBuiltInMethodCallsPhase,uVar11,uVar12);
            if (bVar8) goto LAB_0054c46f;
          }
          if (!isBuiltIn) goto LAB_0054c37a;
        }
        else {
LAB_0054c37a:
          if (isInlined) {
            pJVar15 = JITTimeWorkItem::GetJITFunctionBody(callInstr->m_func->m_workItem);
            uVar11 = JITTimeFunctionBody::GetSourceContextId(pJVar15);
            pFVar16 = JITTimeWorkItem::GetJITTimeInfo(callInstr->m_func->m_workItem);
            uVar12 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar16);
            bVar8 = Js::Phases::IsEnabled
                              ((Phases *)&DAT_015bbe90,FixedScriptMethodInliningPhase,uVar11,uVar12)
            ;
            if (bVar8) goto LAB_0054c46f;
            if (isInlined) goto LAB_0054c422;
          }
          pJVar15 = JITTimeWorkItem::GetJITFunctionBody(callInstr->m_func->m_workItem);
          uVar11 = JITTimeFunctionBody::GetSourceContextId(pJVar15);
          pFVar16 = JITTimeWorkItem::GetJITTimeInfo(callInstr->m_func->m_workItem);
          uVar12 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar16);
          bVar8 = Js::Phases::IsEnabled
                            ((Phases *)&DAT_015c1bd0,FixedScriptMethodCallsPhase,uVar11,uVar12);
          if (!bVar8) goto LAB_0054c46f;
        }
LAB_0054c422:
        if (this_01->objTypeSpecFldInfo == (ObjTypeSpecFldInfo *)0x0) {
          if (!bVar7) {
            return false;
          }
          if ((inlineeInfo == (FunctionJITTimeInfo *)0x0) ||
             (bVar7 = FunctionJITTimeInfo::HasBody(inlineeInfo), !bVar7)) {
            pJVar15 = (JITTimeFunctionBody *)0x0;
          }
          else {
            pJVar15 = FunctionJITTimeInfo::GetBody(inlineeInfo);
          }
          if (pJVar15 == (JITTimeFunctionBody *)0x0) {
            pcVar17 = L"<unknown>";
          }
          else {
            pcVar17 = JITTimeFunctionBody::GetDisplayName(pJVar15);
          }
          pJVar18 = JITTimeWorkItem::GetJITFunctionBody(callInstr->m_func->m_workItem);
          PVar13 = JITTimeFunctionBody::GetPropertyIdFromCacheId
                             (pJVar18,this_01->m_inlineCacheIndex);
          pTVar5 = callInstr->m_func->m_threadContextInfo;
          pTVar35 = (ThreadContext *)pTVar5[-3].wellKnownHostTypeIds;
          if (pTVar5 == (ThreadContextInfo *)0x0) {
            pTVar35 = (ThreadContext *)0x0;
          }
          pPVar27 = ThreadContext::GetPropertyRecord(pTVar35,PVar13);
          pJVar18 = JITTimeWorkItem::GetJITFunctionBody(callInstr->m_func->m_workItem);
          pcVar19 = JITTimeFunctionBody::GetDisplayName(pJVar18);
          pFVar16 = JITTimeWorkItem::GetJITTimeInfo(callInstr->m_func->m_workItem);
          pcVar20 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar16,(wchar (*) [42])local_e8);
          if (inlineeInfo == (FunctionJITTimeInfo *)0x0) {
            local_50 = L"calling";
          }
          if (pJVar15 == (JITTimeFunctionBody *)0x0) {
            pcVar21 = L"(null)";
          }
          else {
            pcVar21 = FunctionJITTimeInfo::GetDebugNumberSet(inlineeInfo,(wchar (*) [42])local_148);
          }
          Output::Print(L"FixedFields: function %s (%s): %s non-fixed method %s (%s %s) (cache id: %d), because inline cache has no cached type.\n"
                        ,pcVar19,pcVar20,local_50,pPVar27 + 1,pcVar17,pcVar21,
                        (ulong)this_01->m_inlineCacheIndex);
          goto LAB_0054c6d7;
        }
        if (isPolymorphic) {
          if (((isInlined) && (this_01->objTypeSpecFldInfo != (ObjTypeSpecFldInfo *)0x0)) &&
             (bVar8 = ObjTypeSpecFldInfo::HasFixedValue(this_01->objTypeSpecFldInfo), bVar8)) {
            this_02 = IR::PropertySymOpnd::GetFixedFunction(this_01,i);
          }
          else {
LAB_0054c746:
            this_02 = (FixedFieldInfo *)0x0;
          }
        }
        else {
          if ((this_01->objTypeSpecFldInfo == (ObjTypeSpecFldInfo *)0x0) ||
             (bVar8 = ObjTypeSpecFldInfo::HasFixedValue(this_01->objTypeSpecFldInfo), !bVar8))
          goto LAB_0054c746;
          this_02 = IR::PropertySymOpnd::GetFixedFunction(this_01);
        }
        if (this_02 == (FixedFieldInfo *)0x0) {
          if (!bVar7) {
            return false;
          }
          if (inlineeInfo == (FunctionJITTimeInfo *)0x0) {
            pJVar15 = (JITTimeFunctionBody *)0x0;
          }
          else {
            bVar7 = FunctionJITTimeInfo::HasBody(inlineeInfo);
            if (bVar7) {
              pJVar15 = FunctionJITTimeInfo::GetBody(inlineeInfo);
            }
            else {
              pJVar15 = (JITTimeFunctionBody *)0x0;
            }
          }
          if (pJVar15 == (JITTimeFunctionBody *)0x0) {
            pcVar17 = L"<unknown>";
          }
          else {
            pcVar17 = JITTimeFunctionBody::GetDisplayName(pJVar15);
          }
          pJVar18 = JITTimeWorkItem::GetJITFunctionBody(callInstr->m_func->m_workItem);
          PVar13 = JITTimeFunctionBody::GetPropertyIdFromCacheId
                             (pJVar18,this_01->m_inlineCacheIndex);
          pTVar5 = callInstr->m_func->m_threadContextInfo;
          pTVar35 = (ThreadContext *)pTVar5[-3].wellKnownHostTypeIds;
          if (pTVar5 == (ThreadContextInfo *)0x0) {
            pTVar35 = (ThreadContext *)0x0;
          }
          pPVar27 = ThreadContext::GetPropertyRecord(pTVar35,PVar13);
          pJVar18 = JITTimeWorkItem::GetJITFunctionBody(callInstr->m_func->m_workItem);
          pcVar19 = JITTimeFunctionBody::GetDisplayName(pJVar18);
          pFVar16 = JITTimeWorkItem::GetJITTimeInfo(callInstr->m_func->m_workItem);
          pcVar20 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar16,(wchar (*) [42])local_e8);
          if (inlineeInfo == (FunctionJITTimeInfo *)0x0) {
            local_50 = L"calling";
          }
          if (pJVar15 == (JITTimeFunctionBody *)0x0) {
            pcVar21 = L"(null)";
          }
          else {
            pcVar21 = FunctionJITTimeInfo::GetDebugNumberSet(inlineeInfo,(wchar (*) [42])local_148);
          }
          uVar2 = this_01->m_inlineCacheIndex;
          if ((this_01->objTypeSpecFldInfo == (ObjTypeSpecFldInfo *)0x0) ||
             (bVar7 = ObjTypeSpecFldInfo::IsLoadedFromProto(this_01->objTypeSpecFldInfo), !bVar7)) {
            if (this_01->objTypeSpecFldInfo == (ObjTypeSpecFldInfo *)0x0) {
              pcVar39 = L"local";
            }
            else {
              bVar7 = ObjTypeSpecFldInfo::UsesAccessor(this_01->objTypeSpecFldInfo);
              pcVar39 = L"local";
              if (bVar7) {
                pcVar39 = L"accessor";
              }
            }
          }
          else {
            pcVar39 = L"proto";
          }
          pcVar36 = 
          L"FixedFields: function %s (%s): %s non-fixed method %s (%s %s) (cache id: %d, layout: %s), because inline cache has no fixed function object.\n"
          ;
LAB_0054d08b:
          Output::Print(pcVar36,pcVar19,pcVar20,local_50,pPVar27 + 1,pcVar17,pcVar21,(ulong)uVar2,
                        pcVar39);
          goto LAB_0054c6d7;
        }
        if (inlineeInfo == (FunctionJITTimeInfo *)0x0) {
          bVar8 = Func::IsBuiltInInlinedInLowerer(callInstr->m_src1);
          if (bVar8) {
            if (!bVar7) {
              return false;
            }
            pJVar15 = JITTimeWorkItem::GetJITFunctionBody(callInstr->m_func->m_workItem);
            PVar13 = JITTimeFunctionBody::GetPropertyIdFromCacheId
                               (pJVar15,this_01->m_inlineCacheIndex);
            pTVar5 = callInstr->m_func->m_threadContextInfo;
            pTVar35 = (ThreadContext *)pTVar5[-3].wellKnownHostTypeIds;
            if (pTVar5 == (ThreadContextInfo *)0x0) {
              pTVar35 = (ThreadContext *)0x0;
            }
            pPVar27 = ThreadContext::GetPropertyRecord(pTVar35,PVar13);
            pJVar15 = JITTimeWorkItem::GetJITFunctionBody(callInstr->m_func->m_workItem);
            pcVar19 = JITTimeFunctionBody::GetDisplayName(pJVar15);
            pFVar16 = JITTimeWorkItem::GetJITTimeInfo(callInstr->m_func->m_workItem);
            pcVar20 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar16,(wchar (*) [42])local_e8);
            uVar2 = this_01->m_inlineCacheIndex;
            if ((this_01->objTypeSpecFldInfo == (ObjTypeSpecFldInfo *)0x0) ||
               (bVar7 = ObjTypeSpecFldInfo::IsLoadedFromProto(this_01->objTypeSpecFldInfo), !bVar7))
            {
              if (this_01->objTypeSpecFldInfo == (ObjTypeSpecFldInfo *)0x0) {
                pcVar39 = L"local";
              }
              else {
                bVar7 = ObjTypeSpecFldInfo::UsesAccessor(this_01->objTypeSpecFldInfo);
                pcVar39 = L"local";
                if (bVar7) {
                  pcVar39 = L"accessor";
                }
              }
            }
            else {
              pcVar39 = L"proto";
            }
            pcVar36 = 
            L"FixedFields: function %s (%s): %s non-fixed method %s (%s %s) (cache id: %d, layout: %s), because callee is a built-in with fast path in lowerer.\n"
            ;
            local_50 = L"calling";
            pcVar17 = L"<unknown>";
            pcVar21 = L"(null)";
            goto LAB_0054d08b;
          }
          if (dontOptimizeJustCheck) {
            return true;
          }
        }
        else {
          iVar22 = FixedFieldInfo::GetFuncInfoAddr(this_02);
          iVar25 = FunctionJITTimeInfo::GetFunctionInfoAddr(inlineeInfo);
          if (iVar22 != iVar25 || dontOptimizeJustCheck) {
            return iVar22 == iVar25;
          }
        }
        if (pIVar28->m_opcode == LdMethodFromFlags) {
          if ((pIVar28->field_0x38 & 0x10) == 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar23 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar23 = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                               ,0x736,"(ldMethodFldInstr->HasBailOutInfo())",
                               "ldMethodFldInstr->HasBailOutInfo()");
            if (!bVar7) goto LAB_0054d099;
            *puVar23 = 0;
          }
          IR::Instr::ClearBailOutInfo(pIVar28);
        }
        pIVar28->m_opcode = CheckFixedFld;
        pOVar26 = IR::Instr::UnlinkDst(pIVar28);
        if (this_01->objTypeSpecFldInfo == (ObjTypeSpecFldInfo *)0x0) {
          kind = BailOutFailedFixedFieldTypeCheck;
        }
        else {
          bVar7 = ObjTypeSpecFldInfo::HasEquivalentTypeSet(this_01->objTypeSpecFldInfo);
          kind = (uint)bVar7 * 2 + BailOutFailedFixedFieldTypeCheck;
        }
        pIVar28 = IR::Instr::ConvertToBailOutInstr(pIVar28,pIVar28,kind,0xffffffff);
        IVar3 = this_01->m_inlineCacheIndex;
        pBVar29 = IR::Instr::GetBailOutInfo(pIVar28);
        pBVar29->polymorphicCacheIndex = IVar3;
        OVar9 = IR::Opnd::GetKind(pIVar28->m_src1);
        if (OVar9 != OpndKindSym) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar23 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar23 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                             ,0x73f,"(chkMethodFldInstr->GetSrc1()->IsSymOpnd())",
                             "chkMethodFldInstr->GetSrc1()->IsSymOpnd()");
          if (!bVar7) goto LAB_0054d099;
          *puVar23 = 0;
        }
        this_03 = IR::Opnd::AsSymOpnd(pIVar28->m_src1);
        bVar7 = IR::SymOpnd::IsPropertySymOpnd(this_03);
        if (bVar7) {
          if (pIVar28->m_opcode != CheckFixedFld) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar23 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar23 = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                               ,0x742,"(chkMethodFldInstr->m_opcode == Js::OpCode::CheckFixedFld)",
                               "chkMethodFldInstr->m_opcode == Js::OpCode::CheckFixedFld");
            if (!bVar7) goto LAB_0054d099;
            *puVar23 = 0;
          }
          pPVar30 = IR::Opnd::AsPropertySymOpnd(pIVar28->m_src1);
          if ((((pPVar30->objTypeSpecFldInfo == (ObjTypeSpecFldInfo *)0x0) ||
               (bVar7 = ObjTypeSpecFldInfo::IsMono(pPVar30->objTypeSpecFldInfo), !bVar7)) &&
              ((pPVar30->objTypeSpecFldInfo == (ObjTypeSpecFldInfo *)0x0 ||
               (bVar7 = ObjTypeSpecFldInfo::IsLoadedFromProto(pPVar30->objTypeSpecFldInfo), !bVar7))
              )) && ((pPVar30->objTypeSpecFldInfo == (ObjTypeSpecFldInfo *)0x0 ||
                     (bVar7 = ObjTypeSpecFldInfo::UsesAccessor(pPVar30->objTypeSpecFldInfo), !bVar7)
                     ))) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar23 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar23 = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                               ,0x745,
                               "(chkMethodFldOpnd->IsMono() || chkMethodFldOpnd->IsLoadedFromProto() || chkMethodFldOpnd->UsesAccessor())"
                               ,
                               "chkMethodFldOpnd->IsMono() || chkMethodFldOpnd->IsLoadedFromProto() || chkMethodFldOpnd->UsesAccessor()"
                              );
            if (!bVar7) goto LAB_0054d099;
            *puVar23 = 0;
          }
          *(byte *)&pPVar30->field_12 = *(byte *)&pPVar30->field_12 | 2;
        }
        if ((((isCtor) &&
             (this_04 = IR::PropertySymOpnd::GetCtorCache(this_01),
             this_04 != (JITTimeConstructorCache *)0x0)) && (callInstr->m_kind == InstrKindProfiled)
            ) && (callInstr->m_opcode != NewScObjArray)) {
          bVar7 = JITTimeConstructorCache::IsUsed(this_04);
          if (bVar7) {
            this_04 = JITTimeConstructorCache::Clone(this_04,this->topFunc->m_alloc);
          }
          bVar7 = JITTimeConstructorCache::IsUsed(this_04);
          if (bVar7) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar23 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar23 = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                               ,0x76e,"(!constructorCache->IsUsed())","!constructorCache->IsUsed()")
            ;
            if (!bVar7) goto LAB_0054d099;
            *puVar23 = 0;
          }
          JITTimeConstructorCache::SetUsed(this_04,true);
          this_00 = callInstr->m_func;
          pPVar31 = IR::Instr::AsProfiledInstr(callInstr);
          Func::SetConstructorCache(this_00,(pPVar31->u).field_3.fldInfoData.f1,this_04);
        }
        iVar22 = FixedFieldInfo::GetFieldValue(this_02);
        src1Opnd = IR::AddrOpnd::New(iVar22,AddrOpndKindDynamicVar,callInstr->m_func,false,(Var)0x0)
        ;
        src1Opnd->m_metadata = this_02;
        src1Opnd->field_0x28 = src1Opnd->field_0x28 | 2;
        pIVar32 = IR::Instr::New(Ld_A,pOVar26,&src1Opnd->super_Opnd,callInstr->m_func);
        pRVar33 = IR::Opnd::AsRegOpnd(pOVar26);
        pSVar24 = pRVar33->m_sym;
        if (((pSVar24->field_0x18 & 1) != 0) && ((pSVar24->field_5).m_instrDef != (Instr *)0x0)) {
          StackSym::SetIsConst(pSVar24);
        }
        valueType = FixedFieldInfo::GetValueType(this_02);
        IR::Opnd::SetValueType(pOVar26,valueType);
        IR::Instr::InsertAfter(pIVar28,pIVar32);
        IR::Instr::ReplaceSrc1(callInstr,&src1Opnd->super_Opnd);
        if ((callInstr->m_opcode == CallI) ||
           (bVar7 = IR::Instr::CallsAccessor(callInstr,this_01), bVar7)) {
          callInstr->m_opcode = CallIFixed;
        }
        else if ((callInstr->m_opcode != NewScObject) && (callInstr->m_opcode != NewScObjArray)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar23 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar23 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                             ,0x7a0,
                             "(callInstr->m_opcode == Js::OpCode::NewScObject || callInstr->m_opcode == Js::OpCode::NewScObjArray)"
                             ,
                             "callInstr->m_opcode == Js::OpCode::NewScObject || callInstr->m_opcode == Js::OpCode::NewScObjArray"
                            );
          if (!bVar7) goto LAB_0054d099;
          *puVar23 = 0;
        }
        if (!isInlined || isBuiltIn) {
          return true;
        }
        if (((this_01->objTypeSpecFldInfo == (ObjTypeSpecFldInfo *)0x0) ||
            (bVar7 = ObjTypeSpecFldInfo::IsRootObjectNonConfigurableField
                               (this_01->objTypeSpecFldInfo), !bVar7)) &&
           (TVar14 = IR::PropertySymOpnd::GetTypeId(this_01), 0x3a < TVar14 - TypeIds_HostDispatch))
        {
          return true;
        }
        *safeThis = true;
        return true;
      }
      pSVar24 = IR::Opnd::GetStackSym(pIVar28->m_src1);
      bVar8 = (pSVar24->field_0x18 & 1) == 0;
      bVar40 = (pSVar24->field_5).m_instrDef == (Instr *)0x0;
      pIVar32 = (pSVar24->field_5).m_instrDef;
      if (bVar40 || bVar8) {
        pIVar32 = pIVar28;
      }
      if ((bool)((bVar40 || bVar8) & bVar7)) {
        if ((inlineeInfo == (FunctionJITTimeInfo *)0x0) ||
           (bVar10 = FunctionJITTimeInfo::HasBody(inlineeInfo), !bVar10)) {
          pJVar15 = (JITTimeFunctionBody *)0x0;
        }
        else {
          pJVar15 = FunctionJITTimeInfo::GetBody(inlineeInfo);
        }
        pcVar39 = L"<unknown>";
        if (pJVar15 != (JITTimeFunctionBody *)0x0) {
          pcVar39 = JITTimeFunctionBody::GetDisplayName(pJVar15);
        }
        pJVar18 = JITTimeWorkItem::GetJITFunctionBody(callInstr->m_func->m_workItem);
        pcVar19 = JITTimeFunctionBody::GetDisplayName(pJVar18);
        pFVar16 = JITTimeWorkItem::GetJITTimeInfo(callInstr->m_func->m_workItem);
        pcVar20 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar16,(wchar (*) [42])local_e8);
        pcVar21 = L"(null)";
        if (pJVar15 != (JITTimeFunctionBody *)0x0) {
          pcVar21 = FunctionJITTimeInfo::GetDebugNumberSet(inlineeInfo,(wchar (*) [42])local_148);
        }
        Output::Print(L"FixedFields: function %s (%s): %s non-fixed method (%s %s), because callee is not single def.\n"
                      ,pcVar19,pcVar20,pcVar17,pcVar39,pcVar21);
        Output::Flush();
        pIVar32 = pIVar28;
      }
      pIVar28 = pIVar32;
    } while (!bVar40 && !bVar8);
  }
  else if (bVar7) {
    if ((inlineeInfo == (FunctionJITTimeInfo *)0x0) ||
       (bVar7 = FunctionJITTimeInfo::HasBody(inlineeInfo), !bVar7)) {
      pJVar15 = (JITTimeFunctionBody *)0x0;
    }
    else {
      pJVar15 = FunctionJITTimeInfo::GetBody(inlineeInfo);
    }
    if (pJVar15 == (JITTimeFunctionBody *)0x0) {
      pcVar17 = L"<unknown>";
    }
    else {
      pcVar17 = JITTimeFunctionBody::GetDisplayName(pJVar15);
    }
    pJVar18 = JITTimeWorkItem::GetJITFunctionBody(callInstr->m_func->m_workItem);
    pcVar19 = JITTimeFunctionBody::GetDisplayName(pJVar18);
    pFVar16 = JITTimeWorkItem::GetJITTimeInfo(callInstr->m_func->m_workItem);
    pcVar20 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar16,(wchar (*) [42])local_e8);
    local_50 = L"inlining";
    if (inlineeInfo == (FunctionJITTimeInfo *)0x0) {
      local_50 = L"calling";
    }
    if (pJVar15 == (JITTimeFunctionBody *)0x0) {
      pcVar21 = L"(null)";
    }
    else {
      pcVar21 = FunctionJITTimeInfo::GetDebugNumberSet(inlineeInfo,(wchar (*) [42])local_148);
    }
    pcVar39 = 
    L"FixedFields: function %s (%s): %s non-fixed method (%s %s), because callee is not single def.\n"
    ;
LAB_0054c593:
    Output::Print(pcVar39,pcVar19,pcVar20,local_50,pcVar17,pcVar21);
LAB_0054c6d7:
    Output::Flush();
    return false;
  }
  return false;
}

Assistant:

bool
Inline::TryOptimizeCallInstrWithFixedMethod(IR::Instr *callInstr, const FunctionJITTimeInfo * inlineeInfo, bool isPolymorphic, bool isBuiltIn, bool isCtor, bool isInlined, bool &safeThis,
                                            bool dontOptimizeJustCheck, uint i /*i-th inlinee at a polymorphic call site*/)
{
    if (PHASE_OFF(Js::FixedMethodsPhase, callInstr->m_func))
    {
        return false;
    }

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
#define TRACE_FIXED_FIELDS 1
#endif

#if TRACE_FIXED_FIELDS
    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
    char16 debugStringBuffer2[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
    bool printFixedFieldsTrace =
        (
            PHASE_TRACE(Js::FixedMethodsPhase, callInstr->m_func) ||
            PHASE_TESTTRACE(Js::FixedMethodsPhase, callInstr->m_func) ||
            (isCtor && (
                PHASE_TRACE(Js::FixedNewObjPhase, callInstr->m_func) ||
                PHASE_TESTTRACE(Js::FixedNewObjPhase, callInstr->m_func)))
        ) && !dontOptimizeJustCheck && !JITManager::GetJITManager()->IsJITServer();

    if (printFixedFieldsTrace)
    {
        JITTimeFunctionBody * calleeFunctionBody = inlineeInfo != nullptr && inlineeInfo->HasBody() ? inlineeInfo->GetBody() : nullptr;
        const char16* calleeName = calleeFunctionBody != nullptr ? calleeFunctionBody->GetDisplayName() : _u("<unknown>");

        Output::Print(_u("FixedFields: function %s (%s): considering method (%s %s): polymorphic = %d, built-in = %d, ctor = %d, inlined = %d, functionInfo = %p.\n"),
            callInstr->m_func->GetJITFunctionBody()->GetDisplayName(), callInstr->m_func->GetDebugNumberSet(debugStringBuffer), calleeName,
            calleeFunctionBody ? inlineeInfo->GetDebugNumberSet(debugStringBuffer2) : _u("(null)"),
            isPolymorphic, isBuiltIn, isCtor, isInlined, inlineeInfo ? inlineeInfo->GetFunctionInfoAddr() : 0);
        Output::Flush();
    }
#endif

    if (isPolymorphic && isInlined)
    {
        Assert(dontOptimizeJustCheck);
    }

    StackSym* methodValueSym = callInstr->GetSrc1()->AsRegOpnd()->m_sym->AsStackSym();
    if (!methodValueSym->IsSingleDef())
    {
#if TRACE_FIXED_FIELDS
        if (printFixedFieldsTrace)
        {
            JITTimeFunctionBody* calleeFunctionBody = inlineeInfo != nullptr && inlineeInfo->HasBody() ? inlineeInfo->GetBody() : nullptr;
            const char16* calleeName = calleeFunctionBody != nullptr ? calleeFunctionBody->GetDisplayName() : _u("<unknown>");

            Output::Print(_u("FixedFields: function %s (%s): %s non-fixed method (%s %s), because callee is not single def.\n"),
                callInstr->m_func->GetJITFunctionBody()->GetDisplayName(), callInstr->m_func->GetDebugNumberSet(debugStringBuffer),
                inlineeInfo != nullptr ? _u("inlining") : _u("calling"), calleeName,
                calleeFunctionBody ? inlineeInfo->GetDebugNumberSet(debugStringBuffer2) : _u("(null)"));
            Output::Flush();
        }
#endif
        return false;
    }

    IR::Instr* ldMethodFldInstr = methodValueSym->GetInstrDef();
    while (ldMethodFldInstr->m_opcode == Js::OpCode::BytecodeArgOutCapture)
    {
        StackSym* sym = ldMethodFldInstr->GetSrc1()->GetStackSym();
        if (!sym->IsSingleDef())
        {
#if TRACE_FIXED_FIELDS
            if (printFixedFieldsTrace)
            {
                JITTimeFunctionBody* calleeFunctionBody = inlineeInfo != nullptr && inlineeInfo->HasBody() ? inlineeInfo->GetBody() : nullptr;
                const char16* calleeName = calleeFunctionBody != nullptr ? calleeFunctionBody->GetDisplayName() : _u("<unknown>");

                Output::Print(_u("FixedFields: function %s (%s): %s non-fixed method (%s %s), because callee is not single def.\n"),
                    callInstr->m_func->GetJITFunctionBody()->GetDisplayName(), callInstr->m_func->GetDebugNumberSet(debugStringBuffer),
                    inlineeInfo != nullptr ? _u("inlining") : _u("calling"), calleeName,
                    calleeFunctionBody ? inlineeInfo->GetDebugNumberSet(debugStringBuffer2) : _u("(null)"));
                Output::Flush();
            }
#endif
            return false;
        }
        ldMethodFldInstr = sym->GetInstrDef();
    }
    if (ldMethodFldInstr->m_opcode != Js::OpCode::ScopedLdMethodFld
        && ldMethodFldInstr->m_opcode != Js::OpCode::LdRootMethodFld
        && ldMethodFldInstr->m_opcode != Js::OpCode::LdMethodFld
        && ldMethodFldInstr->m_opcode != Js::OpCode::LdRootFld
        && ldMethodFldInstr->m_opcode != Js::OpCode::LdFld
        && ldMethodFldInstr->m_opcode != Js::OpCode::LdFldForCallApplyTarget
        && ldMethodFldInstr->m_opcode != Js::OpCode::LdMethodFromFlags)
    {
#if TRACE_FIXED_FIELDS
        if (printFixedFieldsTrace)
        {
            JITTimeFunctionBody* calleeFunctionBody = inlineeInfo != nullptr && inlineeInfo->HasBody() ? inlineeInfo->GetBody() : nullptr;
            const char16* calleeName = calleeFunctionBody != nullptr ? calleeFunctionBody->GetDisplayName() : _u("<unknown>");

            Output::Print(_u("FixedFields: function %s (%s): %s non-fixed method (%s %s), because callee does not come from LdMethodFld.\n"),
                callInstr->m_func->GetJITFunctionBody()->GetDisplayName(), callInstr->m_func->GetDebugNumberSet(debugStringBuffer),
                inlineeInfo != nullptr ? _u("inlining") : _u("calling"), calleeName,
                calleeFunctionBody ? inlineeInfo->GetDebugNumberSet(debugStringBuffer2) : _u("(null)"));
            Output::Flush();
        }
#endif
        return false;
    }

    IR::PropertySymOpnd* methodPropertyOpnd = ldMethodFldInstr->GetSrc1()->AsPropertySymOpnd();

    if ((isCtor &&
            ((isInlined && PHASE_OFF(Js::FixedCtorInliningPhase, callInstr->m_func)) ||
            (!isInlined && PHASE_OFF(Js::FixedCtorCallsPhase, callInstr->m_func)) ||
            (methodPropertyOpnd->UsesAccessor()))) ||
        (!isCtor &&
            ((isBuiltIn &&
                ((isInlined && PHASE_OFF(Js::FixedBuiltInMethodInliningPhase, callInstr->m_func)) ||
                (!isInlined && PHASE_OFF(Js::FixedBuiltInMethodCallsPhase, callInstr->m_func)))) ||
            (!isBuiltIn &&
                ((isInlined && PHASE_OFF(Js::FixedScriptMethodInliningPhase, callInstr->m_func)) ||
                (!isInlined && !PHASE_ON(Js::FixedScriptMethodCallsPhase, callInstr->m_func))))))
       )
    {
#if TRACE_FIXED_FIELDS
        if (printFixedFieldsTrace)
        {
            JITTimeFunctionBody* calleeFunctionBody = inlineeInfo != nullptr && inlineeInfo->HasBody() ? inlineeInfo->GetBody() : nullptr;
            const char16* calleeName = calleeFunctionBody != nullptr ? calleeFunctionBody->GetDisplayName() : _u("<unknown>");

            Js::PropertyId methodPropertyId = callInstr->m_func->GetJITFunctionBody()->GetPropertyIdFromCacheId(methodPropertyOpnd->m_inlineCacheIndex);
            Js::PropertyRecord const * const methodPropertyRecord = callInstr->m_func->GetInProcThreadContext()->GetPropertyRecord(methodPropertyId);

            Output::Print(_u("FixedFields: function %s (#%u): %s non-fixed method %s (%s #%u) (cache id: %d), because %s fixed %s %s is disabled.\n"),
                callInstr->m_func->GetJITFunctionBody()->GetDisplayName(), callInstr->m_func->GetDebugNumberSet(debugStringBuffer),
                inlineeInfo != nullptr ? _u("inlining") : _u("calling"), methodPropertyRecord->GetBuffer(), calleeName,
                calleeFunctionBody ? inlineeInfo->GetDebugNumberSet(debugStringBuffer2) : _u("(null)"),
                methodPropertyOpnd->m_inlineCacheIndex, isInlined ? _u("inlining") : _u("calling"), isBuiltIn ? _u("built-in") : _u("script"),
                isCtor ? _u("ctors") : _u("methods"));
            Output::Flush();
        }
#endif
        return false;
    }

    if (!methodPropertyOpnd->IsObjTypeSpecCandidate() && !methodPropertyOpnd->IsRootObjectNonConfigurableFieldLoad())
    {
#if TRACE_FIXED_FIELDS
        if (printFixedFieldsTrace)
        {
            JITTimeFunctionBody* calleeFunctionBody = inlineeInfo != nullptr && inlineeInfo->HasBody() ? inlineeInfo->GetBody() : nullptr;
            const char16* calleeName = calleeFunctionBody != nullptr ? calleeFunctionBody->GetDisplayName() : _u("<unknown>");
            Js::PropertyId methodPropertyId = callInstr->m_func->GetJITFunctionBody()->GetPropertyIdFromCacheId(methodPropertyOpnd->m_inlineCacheIndex);
            Js::PropertyRecord const * const methodPropertyRecord = callInstr->m_func->GetInProcThreadContext()->GetPropertyRecord(methodPropertyId);

            Output::Print(_u("FixedFields: function %s (%s): %s non-fixed method %s (%s %s) (cache id: %d), because inline cache has no cached type.\n"),
                callInstr->m_func->GetJITFunctionBody()->GetDisplayName(), callInstr->m_func->GetDebugNumberSet(debugStringBuffer),
                inlineeInfo != nullptr ? _u("inlining") : _u("calling"), methodPropertyRecord->GetBuffer(), calleeName,
                calleeFunctionBody ? inlineeInfo->GetDebugNumberSet(debugStringBuffer2) : _u("(null)"),
                methodPropertyOpnd->m_inlineCacheIndex);
            Output::Flush();
        }
#endif
        return false;
    }

    FixedFieldInfo * fixedField = nullptr;
    if (!isPolymorphic)
    {
        fixedField = methodPropertyOpnd->HasFixedValue() ? methodPropertyOpnd->GetFixedFunction() : nullptr;
    }
    else if (isPolymorphic && isInlined)
    {
        fixedField = methodPropertyOpnd->HasFixedValue() ? methodPropertyOpnd->GetFixedFunction(i) : nullptr;
    }

    if (!fixedField)
    {
#if TRACE_FIXED_FIELDS
        if (printFixedFieldsTrace)
        {
            JITTimeFunctionBody* calleeFunctionBody = inlineeInfo != nullptr && inlineeInfo->HasBody() ? inlineeInfo->GetBody() : nullptr;
            const char16* calleeName = calleeFunctionBody != nullptr ? calleeFunctionBody->GetDisplayName() : _u("<unknown>");

            Js::PropertyId methodPropertyId = callInstr->m_func->GetJITFunctionBody()->GetPropertyIdFromCacheId(methodPropertyOpnd->m_inlineCacheIndex);
            Js::PropertyRecord const * const methodPropertyRecord = callInstr->m_func->GetInProcThreadContext()->GetPropertyRecord(methodPropertyId);

            Output::Print(_u("FixedFields: function %s (%s): %s non-fixed method %s (%s %s) (cache id: %d, layout: %s), because inline cache has no fixed function object.\n"),
                callInstr->m_func->GetJITFunctionBody()->GetDisplayName(), callInstr->m_func->GetDebugNumberSet(debugStringBuffer),
                inlineeInfo != nullptr ? _u("inlining") : _u("calling"), methodPropertyRecord->GetBuffer(), calleeName,
                calleeFunctionBody ? inlineeInfo->GetDebugNumberSet(debugStringBuffer2) : _u("(null)"),
                methodPropertyOpnd->m_inlineCacheIndex,
                methodPropertyOpnd->IsLoadedFromProto() ? _u("proto") : methodPropertyOpnd->UsesAccessor() ? _u("accessor") : _u("local"));
            Output::Flush();
        }
#endif
        return false;
    }

    // Certain built-ins that we decide not to inline will get a fast path emitted by the lowerer.
    // The lowering code cannot handle a call with a fixed function target, because it needs access to
    // the original property sym. Turn off fixed method calls for these cases.
    if (inlineeInfo == nullptr && Func::IsBuiltInInlinedInLowerer(callInstr->GetSrc1()))
    {
#if TRACE_FIXED_FIELDS
        if (printFixedFieldsTrace)
        {
            JITTimeFunctionBody* calleeFunctionBody = inlineeInfo != nullptr && inlineeInfo->HasBody() ? inlineeInfo->GetBody() : nullptr;
            const char16* calleeName = calleeFunctionBody != nullptr ? calleeFunctionBody->GetDisplayName() : _u("<unknown>");

            Js::PropertyId methodPropertyId = callInstr->m_func->GetJITFunctionBody()->GetPropertyIdFromCacheId(methodPropertyOpnd->m_inlineCacheIndex);
            Js::PropertyRecord const * const methodPropertyRecord = callInstr->m_func->GetInProcThreadContext()->GetPropertyRecord(methodPropertyId);

            Output::Print(_u("FixedFields: function %s (%s): %s non-fixed method %s (%s %s) (cache id: %d, layout: %s), because callee is a built-in with fast path in lowerer.\n"),
                callInstr->m_func->GetJITFunctionBody()->GetDisplayName(), callInstr->m_func->GetDebugNumberSet(debugStringBuffer),
                inlineeInfo != nullptr ? _u("inlining") : _u("calling"), methodPropertyRecord->GetBuffer(), calleeName,
                calleeFunctionBody ? inlineeInfo->GetDebugNumberSet(debugStringBuffer2) : _u("(null)"),
                methodPropertyOpnd->m_inlineCacheIndex,
                methodPropertyOpnd->IsLoadedFromProto() ? _u("proto") : methodPropertyOpnd->UsesAccessor() ? _u("accessor") : _u("local"));
            Output::Flush();
        }
#endif
        return false;
    }

    if (inlineeInfo != nullptr && fixedField->GetFuncInfoAddr() != inlineeInfo->GetFunctionInfoAddr())
    {
#if TRACE_FIXED_FIELDS && 0// TODO: OOP JIT, trace fixed fields
        if (printFixedFieldsTrace)
        {
            char16 debugStringBuffer3[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
            Js::PropertyId methodPropertyId = callInstr->m_func->GetJITFunctionBody()->GetPropertyIdFromCacheId(methodPropertyOpnd->m_inlineCacheIndex);
            Js::PropertyRecord const * const methodPropertyRecord = callInstr->m_func->GetInProcThreadContext()->GetPropertyRecord(methodPropertyId);
            bool isProto = methodPropertyOpnd->IsLoadedFromProto();
            bool isAccessor = methodPropertyOpnd->UsesAccessor();
            Js::FunctionBody* fixedFunctionBody   = functionObject->GetFunctionInfo()->GetFunctionBody();
            const char16* fixedFunctionNumbers   = fixedFunctionBody ? fixedFunctionBody->GetDebugNumberSet(debugStringBuffer2) : _u("(null)");
            JITTimeFunctionBody* profileFunctionBody = inlineeInfo->GetBody();
            const char16* profileFunctionName    = profileFunctionBody != nullptr ? profileFunctionBody->GetDisplayName() : _u("<unknown>");
            const char16* profileFunctionNumbers = profileFunctionBody ? inlineeInfo->GetDebugNumberSet(debugStringBuffer3) : _u("(null)");

            if (PHASE_TRACE(Js::FixedMethodsPhase, callInstr->m_func))
            {
                intptr_t protoObject = isProto ? methodPropertyOpnd->GetProtoObject() : 0;
                Output::Print(_u("FixedFields: function %s (#%s): function body mismatch for inlinee: %s (%s) 0x%p->0x%p != %s (%s) 0x%p (cache id: %d, layout: %s, type: 0x%p, proto: 0x%p, proto type: 0x%p).\n"),
                    callInstr->m_func->GetJITFunctionBody()->GetDisplayName(), callInstr->m_func->GetDebugNumberSet(debugStringBuffer),
                    methodPropertyRecord->GetBuffer(), fixedFunctionNumbers, functionObject, functionObject->GetFunctionInfo(),
                    profileFunctionName, profileFunctionNumbers, inlineeInfo->GetFunctionInfoAddr(),
                    methodPropertyOpnd->m_inlineCacheIndex, isProto ? _u("proto") : isAccessor ? _u("accessor") : _u("local"),
                    methodPropertyOpnd->GetType(), protoObject, protoObject != nullptr ? protoObject->GetType() : nullptr);
            }
            if (PHASE_TESTTRACE(Js::FixedMethodsPhase, callInstr->m_func))
            {
                Output::Print(_u("FixedFields: function %s (%s): function body mismatch for inlinee: %s (%s) != %s (%s) (cache id: %d, layout: %s).\n"),
                    callInstr->m_func->GetJITFunctionBody()->GetDisplayName(), callInstr->m_func->GetDebugNumberSet(debugStringBuffer),
                    methodPropertyRecord->GetBuffer(), fixedFunctionNumbers, profileFunctionName, profileFunctionNumbers,
                    methodPropertyOpnd->m_inlineCacheIndex, isProto ? _u("proto") : isAccessor ? _u("accessor") : _u("local"));
            }
            Output::Flush();
        }
#endif
        // It appears that under certain bailout and re-JIT conditions we may end up with an updated
        // inline cache pointing to a new function object, while the call site profile info still
        // holds the old function body.  If the two don't match, let's fall back on the regular LdMethodFld.
        return false;
    }
    else
    {
#if TRACE_FIXED_FIELDS && 0// TODO: OOP JIT, trace fixed fields
        if (printFixedFieldsTrace)
        {
            JITTimeFunctionBody* calleeFunctionBody = inlineeInfo != nullptr && inlineeInfo->HasBody() ? inlineeInfo->GetBody() : nullptr;
            Js::PropertyId methodPropertyId = callInstr->m_func->GetJITFunctionBody()->GetPropertyIdFromCacheId(methodPropertyOpnd->m_inlineCacheIndex);
            Js::PropertyRecord const * const methodPropertyRecord = callInstr->m_func->GetInProcThreadContext()->GetPropertyRecord(methodPropertyId);
            const char16* fixedFunctionName = calleeFunctionBody != nullptr ? calleeFunctionBody->GetDisplayName() : _u("<unknown>");
            Js::FunctionBody* fixedFunctionBody = functionObject->GetFunctionInfo()->GetFunctionBody();
            const char16* fixedFunctionNumbers = fixedFunctionBody ? fixedFunctionBody->GetDebugNumberSet(debugStringBuffer2) : _u("(null)");

            Output::Print(_u("FixedFields: function %s (%s): %s fixed method %s (%s %s) (cache id: %d, layout: %s).\n"),
                callInstr->m_func->GetJITFunctionBody()->GetDisplayName(), callInstr->m_func->GetDebugNumberSet(debugStringBuffer),
                inlineeInfo != nullptr ? _u("inlining") : _u("calling"),
                methodPropertyRecord->GetBuffer(), fixedFunctionName, fixedFunctionNumbers,
                methodPropertyOpnd->m_inlineCacheIndex,
                methodPropertyOpnd->IsLoadedFromProto() ? _u("proto") : methodPropertyOpnd->UsesAccessor() ? _u("accessor") : _u("local"));
            Output::Flush();
        }
#endif
    }

#undef TRACE_FIXED_FIELDS

    if (dontOptimizeJustCheck)
    {
        return true;
    }

    // Change Ld[Root]MethodFld, LdMethodFromFlags to CheckFixedFld, which doesn't need a dst.
    if(ldMethodFldInstr->m_opcode == Js::OpCode::LdMethodFromFlags)
    {
        Assert(ldMethodFldInstr->HasBailOutInfo());
        ldMethodFldInstr->ClearBailOutInfo();
    }
    ldMethodFldInstr->m_opcode = Js::OpCode::CheckFixedFld;
    IR::Opnd * methodValueDstOpnd = ldMethodFldInstr->UnlinkDst();
    IR::Instr * chkMethodFldInstr = ldMethodFldInstr->ConvertToBailOutInstr(ldMethodFldInstr,
        !methodPropertyOpnd->HasEquivalentTypeSet() ? IR::BailOutFailedFixedFieldTypeCheck : IR::BailOutFailedEquivalentFixedFieldTypeCheck);
    chkMethodFldInstr->GetBailOutInfo()->polymorphicCacheIndex = methodPropertyOpnd->m_inlineCacheIndex;

    Assert(chkMethodFldInstr->GetSrc1()->IsSymOpnd());
    if (chkMethodFldInstr->GetSrc1()->AsSymOpnd()->IsPropertySymOpnd())
    {
        Assert(chkMethodFldInstr->m_opcode == Js::OpCode::CheckFixedFld);
        IR::PropertySymOpnd* chkMethodFldOpnd = chkMethodFldInstr->GetSrc1()->AsPropertySymOpnd();
        // For polymorphic field loads we only support fixed functions on prototypes. This helps keep the equivalence check helper simple.
        Assert(chkMethodFldOpnd->IsMono() || chkMethodFldOpnd->IsLoadedFromProto() || chkMethodFldOpnd->UsesAccessor());
        chkMethodFldOpnd->SetUsesFixedValue(true);
    }

    if (isCtor)
    {
        JITTimeConstructorCache* constructorCache = methodPropertyOpnd->GetCtorCache();
        if (constructorCache != nullptr && callInstr->IsProfiledInstr())
        {

#if ENABLE_DEBUG_CONFIG_OPTIONS && 0// TODO: OOP JIT, trace fixed fields
            if (PHASE_TRACE(Js::FixedNewObjPhase, callInstr->m_func) || PHASE_TESTTRACE(Js::FixedNewObjPhase, callInstr->m_func))
            {
                JITTimeFunctionBody* calleeFunctionBody = inlineeInfo != nullptr && inlineeInfo->HasBody() ? inlineeInfo->GetBody() : nullptr;
                Js::PropertyId methodPropertyId = callInstr->m_func->GetJITFunctionBody()->GetPropertyIdFromCacheId(methodPropertyOpnd->m_inlineCacheIndex);
                Js::PropertyRecord const * const methodPropertyRecord = callInstr->m_func->GetThreadContextInfo()->GetPropertyRecord(methodPropertyId);
                const char16* fixedFunctionName = calleeFunctionBody != nullptr ? calleeFunctionBody->GetDisplayName() : _u("<unknown>");
                Js::FunctionBody* fixedFunctionBody = functionObject->GetFunctionInfo()->GetFunctionBody();
                const char16* fixedFunctionNumbers = fixedFunctionBody ? fixedFunctionBody->GetDebugNumberSet(debugStringBuffer2) : _u("(null)");

                Output::Print(_u("FixedNewObj: function %s (%s): fixed new object for %s with %s ctor %s (%s %s)%s\n"),
                    callInstr->m_func->GetJITFunctionBody()->GetDisplayName(), callInstr->m_func->GetDebugNumberSet(debugStringBuffer), Js::OpCodeUtil::GetOpCodeName(callInstr->m_opcode),
                    inlineeInfo != nullptr ? _u("inlined") : _u("called"),
                    methodPropertyRecord->GetBuffer(), fixedFunctionName, fixedFunctionNumbers,
                    constructorCache->SkipNewScObject() ? _u(" skip default object") : _u(""));
                Output::Flush();
            }
#endif

            // The profile ID's hung from array ctor opcodes don't match up with normal profiled call sites.
            if (callInstr->m_opcode != Js::OpCode::NewScObjArray)
            {
                // Because we are storing flow sensitive info in the cache (guarded property operations),
                // we must make sure the same cache cannot be used multiple times in the flow.
                if (constructorCache->IsUsed())
                {
                    // It's okay to allocate a JitTimeConstructorCache from the func's allocator (rather than recycler),
                    // because we only use these during JIT. We use the underlying runtime cache as a guard that must
                    // live after JIT, and these are added to the EntryPointInfo during work item creation and thus kept alive.
                    constructorCache = constructorCache->Clone(this->topFunc->m_alloc);
                }
                Assert(!constructorCache->IsUsed());
                constructorCache->SetUsed(true);
                callInstr->m_func->SetConstructorCache(static_cast<Js::ProfileId>(callInstr->AsProfiledInstr()->u.profileId), constructorCache);
            }
        }
        else
        {
#if ENABLE_DEBUG_CONFIG_OPTIONS && 0// TODO: OOP JIT, trace fixed fields
            if (PHASE_TRACE(Js::FixedNewObjPhase, callInstr->m_func) || PHASE_TESTTRACE(Js::FixedNewObjPhase, callInstr->m_func))
            {
                JITTimeFunctionBody* calleeFunctionBody = inlineeInfo != nullptr && inlineeInfo->HasBody() ? inlineeInfo->GetBody() : nullptr;
                Js::PropertyId methodPropertyId = callInstr->m_func->GetJITFunctionBody()->GetPropertyIdFromCacheId(methodPropertyOpnd->m_inlineCacheIndex);
                Js::PropertyRecord const * const methodPropertyRecord = callInstr->m_func->GetThreadContextInfo()->GetPropertyRecord(methodPropertyId);
                const char16* fixedFunctionName = calleeFunctionBody != nullptr ? calleeFunctionBody->GetDisplayName() : _u("<unknown>");
                Js::FunctionBody* fixedFunctionBody = functionObject->GetFunctionInfo()->GetFunctionBody();
                const char16* fixedFunctionNumbers = fixedFunctionBody ? fixedFunctionBody->GetDebugNumberSet(debugStringBuffer2) : _u("(null)");

                Output::Print(_u("FixedNewObj: function %s (%s): non-fixed new object for %s with %s ctor %s (%s %s), because %s.\n"),
                    callInstr->m_func->GetJITFunctionBody()->GetDisplayName(), callInstr->m_func->GetDebugNumberSet(debugStringBuffer), Js::OpCodeUtil::GetOpCodeName(callInstr->m_opcode),
                    inlineeInfo != nullptr ? _u("inlined") : _u("called"),
                    methodPropertyRecord->GetBuffer(), fixedFunctionName, fixedFunctionNumbers,
                    constructorCache == nullptr ? _u("constructor cache hasn't been cloned") : _u("instruction isn't profiled"));
                Output::Flush();
            }
#endif
        }
    }

    // Insert a load instruction to place the constant address in methodOpnd (the Ld[Root]MethodFld's original dst).
    IR::AddrOpnd * constMethodValueOpnd = IR::AddrOpnd::New(fixedField->GetFieldValue(), IR::AddrOpndKind::AddrOpndKindDynamicVar, callInstr->m_func);
    constMethodValueOpnd->m_metadata = fixedField;
    constMethodValueOpnd->m_isFunction = true;
    IR::Instr * ldMethodValueInstr = IR::Instr::New(Js::OpCode::Ld_A, methodValueDstOpnd, constMethodValueOpnd, callInstr->m_func);
    StackSym* methodSym = methodValueDstOpnd->AsRegOpnd()->m_sym;
    if (methodSym->IsSingleDef())
    {
        methodSym->SetIsConst();
    }
    methodValueDstOpnd->SetValueType(fixedField->GetValueType());
    chkMethodFldInstr->InsertAfter(ldMethodValueInstr);
    callInstr->ReplaceSrc1(constMethodValueOpnd);
    if (callInstr->m_opcode == Js::OpCode::CallI || callInstr->CallsAccessor(methodPropertyOpnd))
    {
        callInstr->m_opcode = Js::OpCode::CallIFixed;
    }
    else
    {
        // We patch later for constructor inlining.
        AssertOrFailFast(
            callInstr->m_opcode == Js::OpCode::NewScObject ||
            callInstr->m_opcode == Js::OpCode::NewScObjArray);
    }

    if (!isBuiltIn && isInlined)
    {
        // We eliminate CheckThis for fixed method inlining. Assert here that our assumption is true.
        Js::TypeId typeId = methodPropertyOpnd->IsRootObjectNonConfigurableField() ?
            Js::TypeIds_GlobalObject : methodPropertyOpnd->GetTypeId();
        if(typeId > Js::TypeIds_LastJavascriptPrimitiveType && typeId <= Js::TypeIds_LastTrueJavascriptObjectType)
        {
            // Eliminate CheckThis for inlining.
            safeThis = true;
        }
    }
    return true;
}